

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

WordType llvm::APInt::tcAdd(WordType *dst,WordType *rhs,WordType c,uint parts)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (c < 2) {
    if (parts != 0) {
      uVar2 = 0;
      do {
        uVar1 = dst[uVar2];
        uVar3 = rhs[uVar2];
        if (c == 0) {
          bVar4 = CARRY8(uVar3,uVar1);
          dst[uVar2] = uVar3 + uVar1;
        }
        else {
          uVar3 = uVar1 + uVar3 + 1;
          dst[uVar2] = uVar3;
          bVar4 = uVar3 <= uVar1;
        }
        c = (WordType)bVar4;
        uVar2 = uVar2 + 1;
      } while (parts != uVar2);
    }
    return c;
  }
  __assert_fail("c <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x8fa,
                "static APInt::WordType llvm::APInt::tcAdd(WordType *, const WordType *, WordType, unsigned int)"
               );
}

Assistant:

APInt::WordType APInt::tcAdd(WordType *dst, const WordType *rhs,
                             WordType c, unsigned parts) {
  assert(c <= 1);

  for (unsigned i = 0; i < parts; i++) {
    WordType l = dst[i];
    if (c) {
      dst[i] += rhs[i] + 1;
      c = (dst[i] <= l);
    } else {
      dst[i] += rhs[i];
      c = (dst[i] < l);
    }
  }

  return c;
}